

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::erase
          (Data<QHashPrivate::Node<SubArray,_Macro>_> *this,Bucket bucket)

{
  byte bVar1;
  Span<QHashPrivate::Node<SubArray,_Macro>_> *pSVar2;
  Entry *pEVar3;
  ulong uVar4;
  Span<QHashPrivate::Node<SubArray,_Macro>_> *pSVar5;
  Span<QHashPrivate::Node<SubArray,_Macro>_> *pSVar6;
  size_t bucket_00;
  Span<QHashPrivate::Node<SubArray,_Macro>_> *this_00;
  undefined8 *puVar7;
  Span<QHashPrivate::Node<SubArray,_Macro>_> *this_01;
  size_t fromIndex;
  QLatin1String QVar8;
  
  bucket_00 = bucket.index;
  this_00 = bucket.span;
  Span<QHashPrivate::Node<SubArray,_Macro>_>::erase(this_00,bucket_00);
  this->size = this->size - 1;
  this_01 = this_00;
  fromIndex = bucket_00;
  do {
    pSVar2 = this->spans;
    fromIndex = fromIndex + 1;
    if (fromIndex == 0x80) {
      this_00 = this_00 + 1;
      if (((long)this_00 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7) == 0)
      {
        this_00 = pSVar2;
      }
      fromIndex = 0;
    }
    bVar1 = this_00->offsets[fromIndex];
    if (bVar1 != 0xff) {
      pEVar3 = this_00->entries;
      uVar4 = (ulong)(((uint)bVar1 * 2 + (uint)bVar1) * 0x20);
      puVar7 = *(undefined8 **)((pEVar3->storage).data + uVar4 + 8);
      if (puVar7 == (undefined8 *)0x0) {
        puVar7 = &QByteArray::_empty;
      }
      QVar8.m_data = (char *)((long)puVar7 + *(long *)((pEVar3->storage).data + uVar4 + 0x18));
      QVar8.m_size = *(qsizetype *)((pEVar3->storage).data + uVar4 + 0x20);
      uVar4 = qHash(QVar8,this->seed);
      uVar4 = this->numBuckets - 1 & uVar4;
      pSVar5 = pSVar2 + (uVar4 >> 7);
      uVar4 = (ulong)((uint)uVar4 & 0x7f);
      if (uVar4 != fromIndex || pSVar5 != this_00) {
        do {
          if ((pSVar5 == this_01) && (uVar4 == bucket_00)) {
            if (this_00 == this_01) {
              this_01->offsets[bucket_00] = this_01->offsets[fromIndex];
              this_01->offsets[fromIndex] = 0xff;
              this_01 = this_00;
              bucket_00 = fromIndex;
            }
            else {
              Span<QHashPrivate::Node<SubArray,_Macro>_>::moveFromSpan
                        (this_01,this_00,fromIndex,bucket_00);
              this_01 = this_00;
              bucket_00 = fromIndex;
            }
            break;
          }
          uVar4 = uVar4 + 1;
          if (uVar4 == 0x80) {
            pSVar6 = pSVar5 + 1;
            pSVar5 = pSVar2;
            if (((long)pSVar6 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7)
                != 0) {
              pSVar5 = pSVar6;
            }
            uVar4 = 0;
          }
        } while ((pSVar5 != this_00) || (uVar4 != fromIndex));
      }
    }
    if (bVar1 == 0xff) {
      return;
    }
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }